

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamWriter::QXmlStreamWriter(QXmlStreamWriter *this,QIODevice *device)

{
  QXmlStreamWriterPrivate *pQVar1;
  QXmlStreamWriterPrivate *in_RSI;
  unique_ptr<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_> *in_RDI;
  QXmlStreamWriterPrivate *d;
  pointer in_stack_ffffffffffffffb8;
  QXmlStreamWriter *in_stack_ffffffffffffffe8;
  
  operator_new(0xe0);
  QXmlStreamWriterPrivate::QXmlStreamWriterPrivate(in_RSI,in_stack_ffffffffffffffe8);
  std::unique_ptr<QXmlStreamWriterPrivate,std::default_delete<QXmlStreamWriterPrivate>>::
  unique_ptr<std::default_delete<QXmlStreamWriterPrivate>,void>(in_RDI,in_stack_ffffffffffffffb8);
  pQVar1 = d_func((QXmlStreamWriter *)0x64dd0b);
  pQVar1->device = (QIODevice *)in_RSI;
  return;
}

Assistant:

QXmlStreamWriter::QXmlStreamWriter(QIODevice *device)
    : d_ptr(new QXmlStreamWriterPrivate(this))
{
    Q_D(QXmlStreamWriter);
    d->device = device;
}